

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int64_t archive_seek_data(archive *_a,int64_t offset,int whence)

{
  int iVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  archive *in_RDI;
  int magic_test;
  archive_read *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  int64_t local_8;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    local_8 = -0x1e;
  }
  else if (*(long *)(in_RDI[0x15].archive_format_name + 0x38) == 0) {
    archive_set_error(in_RDI,0x16,"Internal error: No format_seek_data_block function registered");
    local_8 = -0x1e;
  }
  else {
    local_8 = (**(code **)(in_RDI[0x15].archive_format_name + 0x38))(in_RDI,in_RSI,in_EDX);
  }
  return local_8;
}

Assistant:

int64_t
archive_seek_data(struct archive *_a, int64_t offset, int whence)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_seek_data_block");

	if (a->format->seek_data == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Internal error: "
		    "No format_seek_data_block function registered");
		return (ARCHIVE_FATAL);
	}

	return (a->format->seek_data)(a, offset, whence);
}